

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::DecodePixelData
               (uchar **out_images,int *requested_pixel_types,uchar *data_ptr,size_t data_len,
               int compression_type,int line_order,int width,int height,int x_stride,int y,
               int line_no,int num_lines,size_t pixel_data_size,size_t num_attributes,
               EXRAttribute *attributes,size_t num_channels,EXRChannelInfo *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  long in_stack_00000038;
  ulong in_stack_00000050;
  long in_stack_00000058;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000060;
  uint val_7;
  int u_12;
  uint *outLine_3;
  uint *line_ptr_11;
  float val_6;
  int u_11;
  float *outLine_2;
  float *line_ptr_10;
  FP32 f32_3;
  FP16 hf_4;
  int u_10;
  float *outLine_1;
  FP16 hf_3;
  int u_9;
  unsigned_short *outLine;
  unsigned_short *line_ptr_9;
  size_t c_3;
  float *image_11;
  float val_5;
  size_t u_8;
  float *line_ptr_8;
  size_t v_8;
  uint *image_10;
  uint val_4;
  size_t u_7;
  uint *line_ptr_7;
  size_t v_7;
  float *image_9;
  FP32 f32_2;
  unsigned_short *image_8;
  FP16 hf_2;
  size_t u_6;
  unsigned_short *line_ptr_6;
  size_t v_6;
  size_t c_2;
  unsigned_long dstLen_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> outBuf_2;
  float *image_7;
  float val_3;
  size_t u_5;
  float *line_ptr_5;
  size_t v_5;
  uint *image_6;
  uint val_2;
  size_t u_4;
  uint *line_ptr_4;
  size_t v_4;
  float *image_5;
  FP32 f32_1;
  unsigned_short *image_4;
  FP16 hf_1;
  size_t u_3;
  unsigned_short *line_ptr_3;
  size_t v_3;
  size_t c_1;
  unsigned_long dstLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> outBuf_1;
  float *image_3;
  float val_1;
  int u_2;
  float *line_ptr_2;
  int v_2;
  uint *image_2;
  uint val;
  int u_1;
  uint *line_ptr_1;
  int v_1;
  float *image_1;
  FP32 f32;
  unsigned_short *image;
  FP16 hf;
  int u;
  unsigned_short *line_ptr;
  int v;
  int c;
  bool ret;
  size_t tmpBufLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> outBuf;
  int in_stack_00021da4;
  EXRChannelInfo *in_stack_00021da8;
  int in_stack_00021db4;
  size_t in_stack_00021db8;
  uchar *in_stack_00021dc0;
  uchar *in_stack_00021dc8;
  int in_stack_00021de0;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc60;
  allocator_type *in_stack_fffffffffffffc70;
  size_type in_stack_fffffffffffffc78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc80;
  unsigned_long in_stack_fffffffffffffcf8;
  undefined1 *src_size;
  uchar *in_stack_fffffffffffffd00;
  unsigned_long *in_stack_fffffffffffffd08;
  uchar *in_stack_fffffffffffffd10;
  uint local_2b0;
  int local_2ac;
  long local_2a8;
  long local_2a0;
  uint local_298;
  int local_294;
  long local_290;
  long local_288;
  FP16 local_280;
  FP32 local_27c;
  FP16 local_278;
  int local_274;
  long local_270;
  unsigned_short local_268 [2];
  int local_264;
  long local_260;
  long local_258;
  ulong local_250;
  uint *local_248;
  uint local_23c;
  ulong local_238;
  reference local_230;
  ulong local_228;
  uint *local_220;
  uint local_214;
  ulong local_210;
  reference local_208;
  ulong local_200;
  FP32 *local_1f8;
  FP16 local_1f0;
  FP32 local_1ec;
  unsigned_short *local_1e8;
  FP16 local_1dc;
  ulong local_1d8;
  reference local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  size_type local_1b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  uint *local_190;
  uint local_184;
  ulong local_180;
  reference local_178;
  ulong local_170;
  uint *local_168;
  uint local_15c;
  ulong local_158;
  reference local_150;
  ulong local_148;
  FP32 *local_140;
  FP16 local_138;
  FP32 local_134;
  unsigned_short *local_130;
  FP16 local_124;
  ulong local_120;
  reference local_118;
  ulong local_110;
  ulong local_108;
  size_type local_100;
  undefined1 local_f1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  uint *local_d8;
  uint local_d0;
  int local_cc;
  reference local_c8;
  int local_bc;
  uint *local_b8;
  uint local_b0;
  int local_ac;
  reference local_a8;
  int local_9c;
  FP32 *local_98;
  FP16 local_90;
  FP32 local_8c;
  unsigned_short *local_88;
  FP16 local_80;
  int local_7c;
  reference local_78;
  int local_6c;
  int local_68;
  undefined1 local_61;
  long local_60;
  int local_28;
  long local_18;
  long local_10;
  long local_8;
  
  local_28 = in_R9D;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_R8D == 4) {
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x16636b);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x166397);
    local_60 = (in_stack_00000008 * in_stack_00000030) * in_stack_00000038;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_fffffffffffffc60,
               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    iVar3 = in_stack_00000030;
    local_61 = DecompressPiz(in_stack_00021dc8,in_stack_00021dc0,in_stack_00021db8,in_stack_00021db4
                             ,in_stack_00021da8,in_stack_00021da4,in_stack_00021de0);
    for (local_68 = 0; local_68 < (int)in_stack_00000050; local_68 = local_68 + 1) {
      if (*(int *)(in_stack_00000058 + (long)local_68 * 0x110 + 0x100) == 1) {
        for (local_6c = 0; local_6c < in_stack_00000030; local_6c = local_6c + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000060,(long)local_68);
          local_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_fffffffffffffc60,CONCAT44(in_stack_fffffffffffffc5c,iVar3))
          ;
          for (local_7c = 0; local_7c < in_stack_00000008; local_7c = local_7c + 1) {
            local_80.u = *(undefined2 *)(local_78 + (long)local_7c * 2);
            swap2(&local_80.u);
            if (*(int *)(local_10 + (long)local_68 * 4) == 1) {
              if (local_28 == 0) {
                iVar2 = in_stack_00000028 + local_6c;
              }
              else {
                iVar2 = (in_stack_00000010 + -1) - (in_stack_00000028 + local_6c);
              }
              local_88 = (unsigned_short *)
                         (*(long *)(local_8 + (long)local_68 * 8) +
                         (long)(iVar2 * in_stack_00000018 + local_7c) * 2);
              *local_88 = local_80.u;
            }
            else {
              local_90 = local_80;
              local_8c = half_to_float(local_80);
              if (local_28 == 0) {
                iVar2 = in_stack_00000028 + local_6c;
              }
              else {
                iVar2 = (in_stack_00000010 + -1) - (in_stack_00000028 + local_6c);
              }
              local_98 = (FP32 *)(*(long *)(local_8 + (long)local_68 * 8) +
                                 (long)(iVar2 * in_stack_00000018 + local_7c) * 4);
              *local_98 = local_8c;
            }
          }
        }
      }
      else if (*(int *)(in_stack_00000058 + (long)local_68 * 0x110 + 0x100) == 0) {
        for (local_9c = 0; local_9c < in_stack_00000030; local_9c = local_9c + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000060,(long)local_68);
          local_a8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_fffffffffffffc60,CONCAT44(in_stack_fffffffffffffc5c,iVar3))
          ;
          for (local_ac = 0; local_ac < in_stack_00000008; local_ac = local_ac + 1) {
            local_b0 = *(uint *)(local_a8 + (long)local_ac * 4);
            swap4(&local_b0);
            if (local_28 == 0) {
              iVar2 = in_stack_00000028 + local_9c;
            }
            else {
              iVar2 = (in_stack_00000010 + -1) - (in_stack_00000028 + local_9c);
            }
            local_b8 = (uint *)(*(long *)(local_8 + (long)local_68 * 8) +
                               (long)(iVar2 * in_stack_00000018 + local_ac) * 4);
            *local_b8 = local_b0;
          }
        }
      }
      else if (*(int *)(in_stack_00000058 + (long)local_68 * 0x110 + 0x100) == 2) {
        for (local_bc = 0; local_bc < in_stack_00000030; local_bc = local_bc + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000060,(long)local_68);
          local_c8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (in_stack_fffffffffffffc60,CONCAT44(in_stack_fffffffffffffc5c,iVar3))
          ;
          for (local_cc = 0; local_cc < in_stack_00000008; local_cc = local_cc + 1) {
            local_d0 = *(uint *)(local_c8 + (long)local_cc * 4);
            swap4(&local_d0);
            if (local_28 == 0) {
              iVar2 = in_stack_00000028 + local_bc;
            }
            else {
              iVar2 = (in_stack_00000010 + -1) - (in_stack_00000028 + local_bc);
            }
            local_d8 = (uint *)(*(long *)(local_8 + (long)local_68 * 8) +
                               (long)(iVar2 * in_stack_00000018 + local_cc) * 4);
            *local_d8 = local_d0;
          }
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc70);
  }
  else if ((in_R8D == 2) || (in_R8D == 3)) {
    src_size = &local_f1;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x166bfe);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x166c2a);
    local_100 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_f0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_fffffffffffffc60,
               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    DecompressZip(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                  (unsigned_long)src_size);
    for (local_108 = 0; local_108 < in_stack_00000050; local_108 = local_108 + 1) {
      if (*(int *)(in_stack_00000058 + local_108 * 0x110 + 0x100) == 1) {
        for (local_110 = 0; local_110 < (ulong)(long)in_stack_00000030; local_110 = local_110 + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000060,local_108);
          local_118 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (in_stack_fffffffffffffc60,
                                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          for (local_120 = 0; local_120 < (ulong)(long)in_stack_00000008; local_120 = local_120 + 1)
          {
            local_124.u = *(undefined2 *)(local_118 + local_120 * 2);
            swap2(&local_124.u);
            if (*(int *)(local_10 + local_108 * 4) == 1) {
              if (local_28 == 0) {
                lVar1 = ((long)in_stack_00000028 + local_110) * (long)in_stack_00000018;
              }
              else {
                lVar1 = (((long)in_stack_00000010 + -1) - ((long)in_stack_00000028 + local_110)) *
                        (long)in_stack_00000018;
              }
              local_130 = (unsigned_short *)
                          ((lVar1 + local_120) * 2 + *(long *)(local_8 + local_108 * 8));
              *local_130 = local_124.u;
            }
            else {
              local_138 = local_124;
              local_134 = half_to_float(local_124);
              if (local_28 == 0) {
                lVar1 = ((long)in_stack_00000028 + local_110) * (long)in_stack_00000018;
              }
              else {
                lVar1 = (((long)in_stack_00000010 + -1) - ((long)in_stack_00000028 + local_110)) *
                        (long)in_stack_00000018;
              }
              local_140 = (FP32 *)((lVar1 + local_120) * 4 + *(long *)(local_8 + local_108 * 8));
              *local_140 = local_134;
            }
          }
        }
      }
      else if (*(int *)(in_stack_00000058 + local_108 * 0x110 + 0x100) == 0) {
        for (local_148 = 0; local_148 < (ulong)(long)in_stack_00000030; local_148 = local_148 + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000060,local_108);
          local_150 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (in_stack_fffffffffffffc60,
                                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          for (local_158 = 0; local_158 < (ulong)(long)in_stack_00000008; local_158 = local_158 + 1)
          {
            local_15c = *(uint *)(local_150 + local_158 * 4);
            swap4(&local_15c);
            if (local_28 == 0) {
              lVar1 = ((long)in_stack_00000028 + local_148) * (long)in_stack_00000018;
            }
            else {
              lVar1 = (((long)in_stack_00000010 + -1) - ((long)in_stack_00000028 + local_148)) *
                      (long)in_stack_00000018;
            }
            local_168 = (uint *)((lVar1 + local_158) * 4 + *(long *)(local_8 + local_108 * 8));
            *local_168 = local_15c;
          }
        }
      }
      else if (*(int *)(in_stack_00000058 + local_108 * 0x110 + 0x100) == 2) {
        for (local_170 = 0; local_170 < (ulong)(long)in_stack_00000030; local_170 = local_170 + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000060,local_108);
          local_178 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (in_stack_fffffffffffffc60,
                                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          for (local_180 = 0; local_180 < (ulong)(long)in_stack_00000008; local_180 = local_180 + 1)
          {
            local_184 = *(uint *)(local_178 + local_180 * 4);
            swap4(&local_184);
            if (local_28 == 0) {
              lVar1 = ((long)in_stack_00000028 + local_170) * (long)in_stack_00000018;
            }
            else {
              lVar1 = (((long)in_stack_00000010 + -1) - ((long)in_stack_00000028 + local_170)) *
                      (long)in_stack_00000018;
            }
            local_190 = (uint *)((lVar1 + local_180) * 4 + *(long *)(local_8 + local_108 * 8));
            *local_190 = local_184;
          }
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc70);
  }
  else if (in_R8D == 1) {
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x167469);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x16748f);
    local_1b8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_1a8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              (in_stack_fffffffffffffc60,
               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    DecompressRle(in_stack_fffffffffffffd10,(unsigned_long)in_stack_fffffffffffffd08,
                  in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    for (local_1c0 = 0; local_1c0 < in_stack_00000050; local_1c0 = local_1c0 + 1) {
      if (*(int *)(in_stack_00000058 + local_1c0 * 0x110 + 0x100) == 1) {
        for (local_1c8 = 0; local_1c8 < (ulong)(long)in_stack_00000030; local_1c8 = local_1c8 + 1) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000060,local_1c0);
          local_1d0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (in_stack_fffffffffffffc60,
                                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          for (local_1d8 = 0; local_1d8 < (ulong)(long)in_stack_00000008; local_1d8 = local_1d8 + 1)
          {
            local_1dc.u = *(undefined2 *)(local_1d0 + local_1d8 * 2);
            swap2(&local_1dc.u);
            if (*(int *)(local_10 + local_1c0 * 4) == 1) {
              if (local_28 == 0) {
                lVar1 = ((long)in_stack_00000028 + local_1c8) * (long)in_stack_00000018;
              }
              else {
                lVar1 = (((long)in_stack_00000010 + -1) - ((long)in_stack_00000028 + local_1c8)) *
                        (long)in_stack_00000018;
              }
              local_1e8 = (unsigned_short *)
                          ((lVar1 + local_1d8) * 2 + *(long *)(local_8 + local_1c0 * 8));
              *local_1e8 = local_1dc.u;
            }
            else {
              local_1f0 = local_1dc;
              local_1ec = half_to_float(local_1dc);
              if (local_28 == 0) {
                lVar1 = ((long)in_stack_00000028 + local_1c8) * (long)in_stack_00000018;
              }
              else {
                lVar1 = (((long)in_stack_00000010 + -1) - ((long)in_stack_00000028 + local_1c8)) *
                        (long)in_stack_00000018;
              }
              local_1f8 = (FP32 *)((lVar1 + local_1d8) * 4 + *(long *)(local_8 + local_1c0 * 8));
              *local_1f8 = local_1ec;
            }
          }
        }
      }
      else if (*(int *)(in_stack_00000058 + local_1c0 * 0x110 + 0x100) == 0) {
        for (local_200 = 0; local_200 < (ulong)(long)in_stack_00000030; local_200 = local_200 + 1) {
          in_stack_fffffffffffffc70 =
               (allocator_type *)(local_200 * in_stack_00000038 * (long)in_stack_00000008);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000060,local_1c0);
          local_208 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (in_stack_fffffffffffffc60,
                                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          for (local_210 = 0; local_210 < (ulong)(long)in_stack_00000008; local_210 = local_210 + 1)
          {
            local_214 = *(uint *)(local_208 + local_210 * 4);
            swap4(&local_214);
            if (local_28 == 0) {
              lVar1 = ((long)in_stack_00000028 + local_200) * (long)in_stack_00000018;
            }
            else {
              lVar1 = (((long)in_stack_00000010 + -1) - ((long)in_stack_00000028 + local_200)) *
                      (long)in_stack_00000018;
            }
            local_220 = (uint *)((lVar1 + local_210) * 4 + *(long *)(local_8 + local_1c0 * 8));
            *local_220 = local_214;
          }
        }
      }
      else if (*(int *)(in_stack_00000058 + local_1c0 * 0x110 + 0x100) == 2) {
        for (local_228 = 0; local_228 < (ulong)(long)in_stack_00000030; local_228 = local_228 + 1) {
          in_stack_fffffffffffffc60 =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               (local_228 * in_stack_00000038 * (long)in_stack_00000008);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    (in_stack_00000060,local_1c0);
          local_230 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                (in_stack_fffffffffffffc60,
                                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          for (local_238 = 0; local_238 < (ulong)(long)in_stack_00000008; local_238 = local_238 + 1)
          {
            local_23c = *(uint *)(local_230 + local_238 * 4);
            swap4(&local_23c);
            if (local_28 == 0) {
              lVar1 = ((long)in_stack_00000028 + local_228) * (long)in_stack_00000018;
            }
            else {
              lVar1 = (((long)in_stack_00000010 + -1) - ((long)in_stack_00000028 + local_228)) *
                      (long)in_stack_00000018;
            }
            local_248 = (uint *)((lVar1 + local_238) * 4 + *(long *)(local_8 + local_1c0 * 8));
            *local_248 = local_23c;
          }
        }
      }
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc70);
  }
  else if ((in_R8D != 0x80) && (in_R8D == 0)) {
    local_18 = in_RDX;
    for (local_250 = 0; local_250 < in_stack_00000050; local_250 = local_250 + 1) {
      if (*(int *)(in_stack_00000058 + local_250 * 0x110 + 0x100) == 1) {
        local_258 = local_18 + local_250 * (long)in_stack_00000008 * 2;
        if (*(int *)(local_10 + local_250 * 4) == 1) {
          if (local_28 == 0) {
            iVar3 = in_stack_00000020 * in_stack_00000018;
          }
          else {
            iVar3 = ((in_stack_00000010 + -1) - in_stack_00000020) * in_stack_00000018;
          }
          local_260 = *(long *)(local_8 + local_250 * 8) + (long)iVar3 * 2;
          for (local_264 = 0; local_264 < in_stack_00000008; local_264 = local_264 + 1) {
            local_268[0] = *(unsigned_short *)(local_258 + (long)local_264 * 2);
            swap2(local_268);
            *(unsigned_short *)(local_260 + (long)local_264 * 2) = local_268[0];
          }
        }
        else if (*(int *)(local_10 + local_250 * 4) == 2) {
          if (local_28 == 0) {
            iVar3 = in_stack_00000020 * in_stack_00000018;
          }
          else {
            iVar3 = ((in_stack_00000010 + -1) - in_stack_00000020) * in_stack_00000018;
          }
          local_270 = *(long *)(local_8 + local_250 * 8) + (long)iVar3 * 4;
          for (local_274 = 0; local_274 < in_stack_00000008; local_274 = local_274 + 1) {
            local_278.u = *(undefined2 *)(local_258 + (long)local_274 * 2);
            swap2(&local_278.u);
            local_280 = local_278;
            local_27c = half_to_float(local_278);
            *(FP32 *)(local_270 + (long)local_274 * 4) = local_27c;
          }
        }
      }
      else if (*(int *)(in_stack_00000058 + local_250 * 0x110 + 0x100) == 2) {
        local_288 = local_18 + local_250 * (long)in_stack_00000008 * 4;
        if (local_28 == 0) {
          iVar3 = in_stack_00000020 * in_stack_00000018;
        }
        else {
          iVar3 = ((in_stack_00000010 + -1) - in_stack_00000020) * in_stack_00000018;
        }
        local_290 = *(long *)(local_8 + local_250 * 8) + (long)iVar3 * 4;
        for (local_294 = 0; local_294 < in_stack_00000008; local_294 = local_294 + 1) {
          local_298 = *(uint *)(local_288 + (long)local_294 * 4);
          swap4(&local_298);
          *(uint *)(local_290 + (long)local_294 * 4) = local_298;
        }
      }
      else if (*(int *)(in_stack_00000058 + local_250 * 0x110 + 0x100) == 0) {
        local_2a0 = local_18 + local_250 * (long)in_stack_00000008 * 4;
        if (local_28 == 0) {
          iVar3 = in_stack_00000020 * in_stack_00000018;
        }
        else {
          iVar3 = ((in_stack_00000010 + -1) - in_stack_00000020) * in_stack_00000018;
        }
        local_2a8 = *(long *)(local_8 + local_250 * 8) + (long)iVar3 * 4;
        for (local_2ac = 0; local_2ac < in_stack_00000008; local_2ac = local_2ac + 1) {
          local_2b0 = *(uint *)(local_2a0 + (long)local_2ac * 4);
          swap4(&local_2b0);
          *(uint *)(local_2a8 + (long)local_2ac * 4) = local_2b0;
        }
      }
    }
  }
  return;
}

Assistant:

static void DecodePixelData(/* out */ unsigned char **out_images,
                            const int *requested_pixel_types,
                            const unsigned char *data_ptr, size_t data_len,
                            int compression_type, int line_order, int width,
                            int height, int x_stride, int y, int line_no,
                            int num_lines, size_t pixel_data_size,
                            size_t num_attributes,
                            const EXRAttribute *attributes, size_t num_channels,
                            const EXRChannelInfo *channels,
                            const std::vector<size_t> &channel_offset_list) {
  if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {  // PIZ
#if TINYEXR_USE_PIZ
    // Allocate original data size.
    std::vector<unsigned char> outBuf(
        static_cast<size_t>(width * num_lines * pixel_data_size));
    size_t tmpBufLen = static_cast<size_t>(width * num_lines * pixel_data_size);

    bool ret = tinyexr::DecompressPiz(
        reinterpret_cast<unsigned char *>(&outBuf.at(0)), data_ptr, tmpBufLen,
        num_channels, channels, width, num_lines);

    assert(ret);

    // For PIZ_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (int c = 0; c < static_cast<int>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int v = 0; v < num_lines; v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * pixel_data_size * width +
                         channel_offset_list[c] * width));
          for (int u = 0; u < width; u++) {
            FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (line_no + v) * x_stride + u;
              } else {
                image += (height - 1 - (line_no + v)) * x_stride + u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (line_no + v) * x_stride + u;
              } else {
                image += (height - 1 - (line_no + v)) * x_stride + u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (int v = 0; v < num_lines; v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * width +
                         channel_offset_list[c] * width));
          for (int u = 0; u < width; u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (line_no + v) * x_stride + u;
            } else {
              image += (height - 1 - (line_no + v)) * x_stride + u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (int v = 0; v < num_lines; v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * x_stride +
                         channel_offset_list[c] * x_stride));
          for (int u = 0; u < width; u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (line_no + v) * x_stride + u;
            } else {
              image += (height - 1 - (line_no + v)) * x_stride + u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
#else
    assert(0 && "PIZ is enabled in this build");
#endif

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS ||
             compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressZip(reinterpret_cast<unsigned char *>(&outBuf.at(0)),
                           &dstLen, data_ptr,
                           static_cast<unsigned long>(data_len));

    // For ZIP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * static_cast<size_t>(pixel_data_size) *
                             static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              tinyexr::FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressRle(reinterpret_cast<unsigned char *>(&outBuf.at(0)),
                           dstLen, data_ptr,
                           static_cast<unsigned long>(data_len));

    // For ZIP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * static_cast<size_t>(pixel_data_size) *
                             static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              tinyexr::FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param, attributes,
                                 num_attributes)) {
      assert(0);
      return;
    }

    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressZfp(reinterpret_cast<float *>(&outBuf.at(0)), width,
                           num_lines, num_channels, data_ptr,
                           static_cast<unsigned long>(data_len),
                           zfp_compression_param);

    // For ZFP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      assert(channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT);
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
#else
    (void)attributes;
    (void)num_attributes;
    (void)num_channels;
    assert(0);
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    for (size_t c = 0; c < num_channels; c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        const unsigned short *line_ptr =
            reinterpret_cast<const unsigned short *>(
                data_ptr +
                c * static_cast<size_t>(width) * sizeof(unsigned short));

        if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          unsigned short *outLine =
              reinterpret_cast<unsigned short *>(out_images[c]);
          if (line_order == 0) {
            outLine += y * x_stride;
          } else {
            outLine += (height - 1 - y) * x_stride;
          }

          for (int u = 0; u < width; u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            outLine[u] = hf.u;
          }
        } else if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          float *outLine = reinterpret_cast<float *>(out_images[c]);
          if (line_order == 0) {
            outLine += y * x_stride;
          } else {
            outLine += (height - 1 - y) * x_stride;
          }

          for (int u = 0; u < width; u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            tinyexr::FP32 f32 = half_to_float(hf);

            outLine[u] = f32.f;
          }
        } else {
          assert(0);
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        const float *line_ptr = reinterpret_cast<const float *>(
            data_ptr + c * static_cast<size_t>(width) * sizeof(float));

        float *outLine = reinterpret_cast<float *>(out_images[c]);
        if (line_order == 0) {
          outLine += y * x_stride;
        } else {
          outLine += (height - 1 - y) * x_stride;
        }

        for (int u = 0; u < width; u++) {
          float val = line_ptr[u];

          tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

          outLine[u] = val;
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        const unsigned int *line_ptr = reinterpret_cast<const unsigned int *>(
            data_ptr + c * static_cast<size_t>(width) * sizeof(unsigned int));

        unsigned int *outLine = reinterpret_cast<unsigned int *>(out_images[c]);
        if (line_order == 0) {
          outLine += y * x_stride;
        } else {
          outLine += (height - 1 - y) * x_stride;
        }

        for (int u = 0; u < width; u++) {
          unsigned int val = line_ptr[u];

          tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

          outLine[u] = val;
        }
      }
    }
  }
}